

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeFolding.cpp
# Opt level: O0

void __thiscall wasm::CodeFolding::visitIf(CodeFolding *this,If *curr)

{
  initializer_list<wasm::CodeFolding::Tail> __l;
  bool bVar1;
  allocator<wasm::CodeFolding::Tail> local_91;
  Tail local_90;
  Tail local_78;
  Tail *local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> tails;
  anon_class_8_1_8991fb9c maybeAddBlock;
  Block *right;
  Block *left;
  If *local_18;
  If *curr_local;
  CodeFolding *this_local;
  
  if (curr->ifFalse != (Expression *)0x0) {
    left._4_4_ = 1;
    local_18 = curr;
    curr_local = (If *)this;
    bVar1 = wasm::Type::operator==(&curr->condition->type,(BasicType *)((long)&left + 4));
    if (!bVar1) {
      right = Expression::dynCast<wasm::Block>(local_18->ifTrue);
      maybeAddBlock.this = (CodeFolding *)Expression::dynCast<wasm::Block>(local_18->ifFalse);
      tails.super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
      if ((right == (Block *)0x0) || (maybeAddBlock.this != (CodeFolding *)0x0)) {
        if ((right == (Block *)0x0) && (maybeAddBlock.this != (CodeFolding *)0x0)) {
          right = visitIf::anon_class_8_1_8991fb9c::operator()
                            ((anon_class_8_1_8991fb9c *)
                             &tails.
                              super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (Block *)maybeAddBlock.this,&local_18->ifTrue);
        }
      }
      else {
        maybeAddBlock.this =
             (CodeFolding *)
             visitIf::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)
                        &tails.
                         super__Vector_base<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,right,&local_18->ifFalse
                       );
      }
      if ((((right != (Block *)0x0) && (maybeAddBlock.this != (CodeFolding *)0x0)) &&
          (bVar1 = IString::is(&(right->name).super_IString), !bVar1)) &&
         (bVar1 = IString::is((IString *)
                              &((maybeAddBlock.this)->
                               super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                               ).super_Pass.name), !bVar1)) {
        Tail::Tail(&local_90,right);
        Tail::Tail(&local_78,(Block *)maybeAddBlock.this);
        local_58 = 2;
        local_60 = &local_90;
        std::allocator<wasm::CodeFolding::Tail>::allocator(&local_91);
        __l._M_len = local_58;
        __l._M_array = local_60;
        std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::vector
                  ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                   local_50,__l,&local_91);
        std::allocator<wasm::CodeFolding::Tail>::~allocator(&local_91);
        optimizeExpressionTails<wasm::If>
                  (this,(vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *
                        )local_50,local_18);
        std::vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_>::~vector
                  ((vector<wasm::CodeFolding::Tail,_std::allocator<wasm::CodeFolding::Tail>_> *)
                   local_50);
      }
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (!curr->ifFalse) {
      return;
    }
    if (curr->condition->type == Type::unreachable) {
      // If the arms are foldable and concrete, we would be replacing an
      // unreachable If with a concrete block, which may or may not be valid,
      // depending on the context. Leave this for DCE rather than trying to
      // handle that.
      return;
    }
    // If both are blocks, look for a tail we can merge.
    auto* left = curr->ifTrue->dynCast<Block>();
    auto* right = curr->ifFalse->dynCast<Block>();
    // If one is a block and the other isn't, and the non-block is a tail of the
    // other, we can fold that - for our convenience, we just add a block and
    // run the rest of the optimization mormally.
    auto maybeAddBlock = [this](Block* block, Expression*& other) -> Block* {
      // If other is a suffix of the block, wrap it in a block.
      if (block->list.empty() ||
          !ExpressionAnalyzer::equal(other, block->list.back())) {
        return nullptr;
      }
      // Do it, assign to the out param `other`, and return the block.
      Builder builder(*getModule());
      auto* ret = builder.makeBlock(other);
      other = ret;
      return ret;
    };
    if (left && !right) {
      right = maybeAddBlock(left, curr->ifFalse);
    } else if (!left && right) {
      left = maybeAddBlock(right, curr->ifTrue);
    }
    // We need nameless blocks, as if there is a name, someone might branch to
    // the end, skipping the code we want to merge.
    if (left && right && !left->name.is() && !right->name.is()) {
      std::vector<Tail> tails = {Tail(left), Tail(right)};
      optimizeExpressionTails(tails, curr);
    }
  }